

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<8>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  BVH *bvh;
  size_t sVar3;
  ulong uVar4;
  RTCIntersectArguments *pRVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  char cVar22;
  bool bVar23;
  int iVar24;
  AABBNodeMB4D *node1;
  ulong uVar25;
  undefined4 uVar26;
  uint uVar27;
  RTCIntersectArguments *pRVar28;
  uint uVar29;
  ulong uVar30;
  ulong *puVar31;
  long lVar32;
  NodeRef root;
  undefined1 (*pauVar33) [32];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar47 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 in_ZMM5 [64];
  float fVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  vfloat4 a0;
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  vbool<8> terminated;
  vbool<8> valid_o;
  TravRayK<8,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  undefined1 local_2b80 [8];
  float fStack_2b78;
  float fStack_2b74;
  float fStack_2b70;
  float fStack_2b6c;
  float fStack_2b68;
  float fStack_2b64;
  undefined1 local_2b20 [32];
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2aa0;
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [8];
  float fStack_29f8;
  float fStack_29f4;
  float fStack_29f0;
  float fStack_29ec;
  float fStack_29e8;
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  float local_2980;
  float fStack_297c;
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  undefined4 uStack_2964;
  float local_2960;
  float fStack_295c;
  float fStack_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  float fStack_2948;
  undefined4 uStack_2944;
  float local_2940;
  float fStack_293c;
  float fStack_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  undefined4 uStack_2924;
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  float local_2800;
  float fStack_27fc;
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  float fStack_27e4;
  float local_27e0;
  float fStack_27dc;
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  float fStack_27c4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  RTCIntersectArguments local_27a0;
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  bvh = (BVH *)This->ptr;
  sVar3 = (bvh->root).ptr;
  if (sVar3 != 8) {
    auVar38 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar68 = *(undefined1 (*) [32])(ray + 0x100);
    auVar65 = vpcmpeqd_avx2(auVar38,(undefined1  [32])valid_i->field_0);
    auVar38 = vcmpps_avx(auVar68,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar38 = vandps_avx(auVar38,auVar65);
    uVar29 = vmovmskps_avx(auVar38);
    if (uVar29 != 0) {
      auVar36 = vpackssdw_avx(auVar38._0_16_,auVar38._16_16_);
      local_2a40 = *(undefined1 (*) [32])(ray + 0x80);
      local_2a20 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_2a00 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar57._0_4_ = local_2a00._0_4_ * local_2a00._0_4_;
      auVar57._4_4_ = local_2a00._4_4_ * local_2a00._4_4_;
      auVar57._8_4_ = local_2a00._8_4_ * local_2a00._8_4_;
      auVar57._12_4_ = local_2a00._12_4_ * local_2a00._12_4_;
      auVar57._16_4_ = local_2a00._16_4_ * local_2a00._16_4_;
      auVar57._20_4_ = local_2a00._20_4_ * local_2a00._20_4_;
      auVar57._28_36_ = in_ZMM5._28_36_;
      auVar57._24_4_ = local_2a00._24_4_ * local_2a00._24_4_;
      auVar47 = vfmadd231ps_fma(auVar57._0_32_,local_2a20,local_2a20);
      auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),local_2a40,local_2a40);
      auVar38 = vrsqrtps_avx(ZEXT1632(auVar47));
      pRVar28 = &local_27a0;
      uVar30 = (ulong)(uVar29 & 0xff);
      fVar81 = auVar38._0_4_;
      fVar34 = auVar38._4_4_;
      fVar35 = auVar38._8_4_;
      fVar40 = auVar38._12_4_;
      fVar42 = auVar38._16_4_;
      fVar44 = auVar38._20_4_;
      fVar39 = auVar38._24_4_;
      auVar65._4_4_ = fVar34 * fVar34 * fVar34 * auVar47._4_4_ * -0.5;
      auVar65._0_4_ = fVar81 * fVar81 * fVar81 * auVar47._0_4_ * -0.5;
      auVar65._8_4_ = fVar35 * fVar35 * fVar35 * auVar47._8_4_ * -0.5;
      auVar65._12_4_ = fVar40 * fVar40 * fVar40 * auVar47._12_4_ * -0.5;
      auVar65._16_4_ = fVar42 * fVar42 * fVar42 * -0.0;
      auVar65._20_4_ = fVar44 * fVar44 * fVar44 * -0.0;
      auVar65._24_4_ = fVar39 * fVar39 * fVar39 * -0.0;
      auVar65._28_4_ = 0;
      auVar85._8_4_ = 0x3fc00000;
      auVar85._0_8_ = 0x3fc000003fc00000;
      auVar85._12_4_ = 0x3fc00000;
      auVar85._16_4_ = 0x3fc00000;
      auVar85._20_4_ = 0x3fc00000;
      auVar85._24_4_ = 0x3fc00000;
      auVar85._28_4_ = 0x3fc00000;
      auVar47 = vfmadd213ps_fma(auVar85,auVar38,auVar65);
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar47);
      auVar75._8_4_ = 0x80000000;
      auVar75._0_8_ = 0x8000000080000000;
      auVar75._12_4_ = 0x80000000;
      auVar47._12_4_ = 0;
      auVar47._0_12_ = ZEXT812(0);
      auVar47 = auVar47 << 0x20;
      do {
        lVar32 = 0;
        for (uVar25 = uVar30; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
          lVar32 = lVar32 + 1;
        }
        uVar25 = (ulong)(uint)((int)lVar32 * 4);
        auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar25 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar25 + 0xa0)),0x1c);
        auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + uVar25 + 0xc0)),0x28);
        fVar81 = *(float *)((long)&local_27c0 + uVar25);
        auVar92._0_4_ = auVar90._0_4_ * fVar81;
        auVar92._4_4_ = auVar90._4_4_ * fVar81;
        auVar92._8_4_ = auVar90._8_4_ * fVar81;
        auVar92._12_4_ = auVar90._12_4_ * fVar81;
        auVar99 = vshufpd_avx(auVar92,auVar92,1);
        auVar90 = vmovshdup_avx(auVar92);
        auVar97 = vunpckhps_avx(auVar92,auVar47);
        auVar96._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
        auVar96._8_8_ = auVar99._8_8_ ^ auVar75._8_8_;
        auVar96 = vinsertps_avx(auVar96,auVar92,0x2a);
        auVar97 = vshufps_avx(auVar97,ZEXT416(auVar90._0_4_ ^ 0x80000000),0x41);
        auVar90 = vdpps_avx(auVar96,auVar96,0x7f);
        auVar99 = vdpps_avx(auVar97,auVar97,0x7f);
        auVar90 = vcmpps_avx(auVar90,auVar99,1);
        auVar101._0_4_ = auVar90._0_4_;
        auVar101._4_4_ = auVar101._0_4_;
        auVar101._8_4_ = auVar101._0_4_;
        auVar101._12_4_ = auVar101._0_4_;
        auVar90 = vblendvps_avx(auVar96,auVar97,auVar101);
        auVar99 = vdpps_avx(auVar90,auVar90,0x7f);
        auVar96 = vrsqrtss_avx(auVar99,auVar99);
        fVar34 = auVar96._0_4_;
        fVar34 = fVar34 * 1.5 - auVar99._0_4_ * 0.5 * fVar34 * fVar34 * fVar34;
        auVar97._0_4_ = auVar90._0_4_ * fVar34;
        auVar97._4_4_ = auVar90._4_4_ * fVar34;
        auVar97._8_4_ = auVar90._8_4_ * fVar34;
        auVar97._12_4_ = auVar90._12_4_ * fVar34;
        auVar90 = vshufps_avx(auVar97,auVar97,0xc9);
        auVar99 = vshufps_avx(auVar92,auVar92,0xc9);
        auVar102._0_4_ = auVar97._0_4_ * auVar99._0_4_;
        auVar102._4_4_ = auVar97._4_4_ * auVar99._4_4_;
        auVar102._8_4_ = auVar97._8_4_ * auVar99._8_4_;
        auVar102._12_4_ = auVar97._12_4_ * auVar99._12_4_;
        auVar90 = vfmsub231ps_fma(auVar102,auVar92,auVar90);
        auVar96 = vshufps_avx(auVar90,auVar90,0xc9);
        auVar90 = vdpps_avx(auVar96,auVar96,0x7f);
        lVar32 = lVar32 * 0x30;
        auVar99 = vrsqrtss_avx(auVar90,auVar90);
        fVar34 = auVar99._0_4_;
        fVar34 = fVar34 * 1.5 - auVar90._0_4_ * 0.5 * fVar34 * fVar34 * fVar34;
        uVar30 = uVar30 - 1 & uVar30;
        auVar99._0_4_ = fVar34 * auVar96._0_4_;
        auVar99._4_4_ = fVar34 * auVar96._4_4_;
        auVar99._8_4_ = fVar34 * auVar96._8_4_;
        auVar99._12_4_ = fVar34 * auVar96._12_4_;
        auVar90._0_4_ = fVar81 * auVar92._0_4_;
        auVar90._4_4_ = fVar81 * auVar92._4_4_;
        auVar90._8_4_ = fVar81 * auVar92._8_4_;
        auVar90._12_4_ = fVar81 * auVar92._12_4_;
        auVar96 = vunpcklps_avx(auVar97,auVar90);
        auVar90 = vunpckhps_avx(auVar97,auVar90);
        auVar97 = vunpcklps_avx(auVar99,auVar47);
        auVar99 = vunpckhps_avx(auVar99,auVar47);
        auVar99 = vunpcklps_avx(auVar90,auVar99);
        auVar92 = vunpcklps_avx(auVar96,auVar97);
        auVar90 = vunpckhps_avx(auVar96,auVar97);
        ((RayQueryContext *)((long)pRVar28 + lVar32))->scene = (Scene *)auVar92._0_8_;
        ((RayQueryContext *)((long)pRVar28 + lVar32))->user = (RTCRayQueryContext *)auVar92._8_8_;
        *(undefined1 (*) [16])(auStack_2780 + lVar32 + -0x10) = auVar90;
        *(undefined1 (*) [16])(auStack_2780 + lVar32) = auVar99;
      } while (uVar30 != 0);
      local_2aa0._0_4_ = *(undefined4 *)ray;
      local_2aa0._4_4_ = *(undefined4 *)(ray + 4);
      local_2aa0._8_4_ = *(undefined4 *)(ray + 8);
      local_2aa0._12_4_ = *(undefined4 *)(ray + 0xc);
      local_2aa0._16_4_ = *(undefined4 *)(ray + 0x10);
      local_2aa0._20_4_ = *(undefined4 *)(ray + 0x14);
      local_2aa0._24_4_ = *(undefined4 *)(ray + 0x18);
      local_2aa0._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_2aa0._32_4_ = *(undefined4 *)(ray + 0x20);
      local_2aa0._36_4_ = *(undefined4 *)(ray + 0x24);
      local_2aa0._40_4_ = *(undefined4 *)(ray + 0x28);
      local_2aa0._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_2aa0._48_4_ = *(undefined4 *)(ray + 0x30);
      local_2aa0._52_4_ = *(undefined4 *)(ray + 0x34);
      local_2aa0._56_4_ = *(undefined4 *)(ray + 0x38);
      local_2aa0._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_2aa0.field_0.z.field_0 = (vfloat_impl<8>)*(undefined1 (*) [32])(ray + 0x40);
      local_2840._8_4_ = 0x7fffffff;
      local_2840._0_8_ = 0x7fffffff7fffffff;
      local_2840._12_4_ = 0x7fffffff;
      local_2840._16_4_ = 0x7fffffff;
      local_2840._20_4_ = 0x7fffffff;
      local_2840._24_4_ = 0x7fffffff;
      local_2840._28_4_ = 0x7fffffff;
      auVar38 = vandps_avx(local_2840,local_2a40);
      auVar93._8_4_ = 0x219392ef;
      auVar93._0_8_ = 0x219392ef219392ef;
      auVar93._12_4_ = 0x219392ef;
      auVar93._16_4_ = 0x219392ef;
      auVar93._20_4_ = 0x219392ef;
      auVar93._24_4_ = 0x219392ef;
      auVar93._28_4_ = 0x219392ef;
      auVar38 = vcmpps_avx(auVar38,auVar93,1);
      auVar65 = vblendvps_avx(local_2a40,auVar93,auVar38);
      auVar38 = vandps_avx(local_2840,local_2a20);
      auVar38 = vcmpps_avx(auVar38,auVar93,1);
      auVar85 = vblendvps_avx(local_2a20,auVar93,auVar38);
      auVar38 = vandps_avx(local_2840,_local_2a00);
      auVar38 = vcmpps_avx(auVar38,auVar93,1);
      auVar58 = vrcpps_avx(auVar65);
      auVar38 = vblendvps_avx(_local_2a00,auVar93,auVar38);
      auVar94._8_4_ = 0x3f800000;
      auVar94._0_8_ = 0x3f8000003f800000;
      auVar94._12_4_ = 0x3f800000;
      auVar94._16_4_ = 0x3f800000;
      auVar94._20_4_ = 0x3f800000;
      auVar94._24_4_ = 0x3f800000;
      auVar94._28_4_ = 0x3f800000;
      auVar59 = vrcpps_avx(auVar85);
      auVar47 = vfnmadd213ps_fma(auVar65,auVar58,auVar94);
      auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar58,auVar58);
      auVar75 = vfnmadd213ps_fma(auVar85,auVar59,auVar94);
      auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar59,auVar59);
      auVar65 = vrcpps_avx(auVar38);
      auVar90 = vfnmadd213ps_fma(auVar38,auVar65,auVar94);
      auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar65,auVar65);
      local_29e0 = ZEXT1632(auVar47);
      local_29c0 = ZEXT1632(auVar75);
      local_29a0 = ZEXT1632(auVar90);
      local_2980 = auVar47._0_4_ * (float)local_2aa0._0_4_;
      fStack_297c = auVar47._4_4_ * (float)local_2aa0._4_4_;
      fStack_2978 = auVar47._8_4_ * (float)local_2aa0._8_4_;
      fStack_2974 = auVar47._12_4_ * (float)local_2aa0._12_4_;
      fStack_2970 = (float)local_2aa0._16_4_ * 0.0;
      fStack_296c = (float)local_2aa0._20_4_ * 0.0;
      uStack_2964 = auVar65._28_4_;
      fStack_2968 = (float)local_2aa0._24_4_ * 0.0;
      local_2960 = (float)local_2aa0._32_4_ * auVar75._0_4_;
      fStack_295c = (float)local_2aa0._36_4_ * auVar75._4_4_;
      fStack_2958 = (float)local_2aa0._40_4_ * auVar75._8_4_;
      fStack_2954 = (float)local_2aa0._44_4_ * auVar75._12_4_;
      fStack_2950 = (float)local_2aa0._48_4_ * 0.0;
      fStack_294c = (float)local_2aa0._52_4_ * 0.0;
      fStack_2948 = (float)local_2aa0._56_4_ * 0.0;
      local_2940 = local_2aa0._64_4_ * auVar90._0_4_;
      fStack_293c = local_2aa0._68_4_ * auVar90._4_4_;
      fStack_2938 = local_2aa0._72_4_ * auVar90._8_4_;
      fStack_2934 = local_2aa0._76_4_ * auVar90._12_4_;
      fStack_2930 = local_2aa0._80_4_ * 0.0;
      fStack_292c = local_2aa0._84_4_ * 0.0;
      fStack_2928 = local_2aa0._88_4_ * 0.0;
      auVar65 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar38 = vcmpps_avx(local_29e0,auVar65,1);
      auVar76._8_4_ = 0x10;
      auVar76._0_8_ = 0x1000000010;
      auVar76._12_4_ = 0x10;
      auVar76._16_4_ = 0x10;
      auVar76._20_4_ = 0x10;
      auVar76._24_4_ = 0x10;
      auVar76._28_4_ = 0x10;
      local_2920 = vandps_avx(auVar38,auVar76);
      auVar58._8_4_ = 0x20;
      auVar58._0_8_ = 0x2000000020;
      auVar58._12_4_ = 0x20;
      auVar58._16_4_ = 0x20;
      auVar58._20_4_ = 0x20;
      auVar58._24_4_ = 0x20;
      auVar58._28_4_ = 0x20;
      auVar77._8_4_ = 0x30;
      auVar77._0_8_ = 0x3000000030;
      auVar77._12_4_ = 0x30;
      auVar77._16_4_ = 0x30;
      auVar77._20_4_ = 0x30;
      auVar77._24_4_ = 0x30;
      auVar77._28_4_ = 0x30;
      auVar38 = vcmpps_avx(ZEXT1632(auVar75),auVar65,5);
      local_2900 = vblendvps_avx(auVar77,auVar58,auVar38);
      auVar59._8_4_ = 0x40;
      auVar59._0_8_ = 0x4000000040;
      auVar59._12_4_ = 0x40;
      auVar59._16_4_ = 0x40;
      auVar59._20_4_ = 0x40;
      auVar59._24_4_ = 0x40;
      auVar59._28_4_ = 0x40;
      auVar72._8_4_ = 0x50;
      auVar72._0_8_ = 0x5000000050;
      auVar72._12_4_ = 0x50;
      auVar72._16_4_ = 0x50;
      auVar72._20_4_ = 0x50;
      auVar72._24_4_ = 0x50;
      auVar72._28_4_ = 0x50;
      auVar65 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar38 = vcmpps_avx(ZEXT1632(auVar90),auVar65,5);
      local_28e0 = vblendvps_avx(auVar72,auVar59,auVar38);
      auVar38 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar65);
      auVar68 = vmaxps_avx(auVar68,auVar65);
      local_2880 = vpmovsxwd_avx2(auVar36);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar103 = ZEXT3264(local_1e80);
      local_28c0 = vblendvps_avx(local_1e80,auVar38,local_2880);
      auVar38._8_4_ = 0xff800000;
      auVar38._0_8_ = 0xff800000ff800000;
      auVar38._12_4_ = 0xff800000;
      auVar38._16_4_ = 0xff800000;
      auVar38._20_4_ = 0xff800000;
      auVar38._24_4_ = 0xff800000;
      auVar38._28_4_ = 0xff800000;
      local_28a0 = vblendvps_avx(auVar38,auVar68,local_2880);
      auVar47 = vpcmpeqd_avx(local_28a0._0_16_,local_28a0._0_16_);
      local_2ae0 = vpmovsxwd_avx2(auVar36 ^ auVar47);
      auVar57 = ZEXT3264(local_2ae0);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar29 = 5;
      }
      else {
        pRVar28 = context->args;
        uVar29 = (uint)(((ulong)*(Scene **)&pRVar28->flags & 0x10000) == 0) * 3 + 2;
      }
      puVar31 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar33 = (undefined1 (*) [32])local_1e40;
      local_2608 = sVar3;
      local_1e60 = local_28c0;
      local_2860 = mm_lookupmask_ps._16_8_;
      uStack_2858 = mm_lookupmask_ps._24_8_;
      uStack_2850 = mm_lookupmask_ps._16_8_;
      uStack_2848 = mm_lookupmask_ps._24_8_;
      uStack_2944 = local_2aa0._28_4_;
      uStack_2924 = local_2aa0._60_4_;
LAB_0054bb1f:
      do {
        do {
          root.ptr = puVar31[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0054c2ed;
          puVar31 = puVar31 + -1;
          pauVar33 = pauVar33 + -1;
          auVar68 = *pauVar33;
          auVar71 = ZEXT3264(auVar68);
          auVar38 = vcmpps_avx(auVar68,local_28a0,1);
        } while ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar38 >> 0x7f,0) == '\0') &&
                   (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar38 >> 0xbf,0) == '\0') &&
                 (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar38[0x1f]);
        uVar26 = vmovmskps_avx(auVar38);
        pRVar28 = (RTCIntersectArguments *)CONCAT44((int)((ulong)pRVar28 >> 0x20),uVar26);
        if (uVar29 < (uint)POPCOUNT(uVar26)) {
LAB_0054bb5c:
          do {
            auVar68 = local_2ae0;
            iVar24 = 4;
            lVar32 = -0x10;
            uVar30 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0054c2ed;
              auVar38 = vcmpps_avx(local_28a0,auVar71._0_32_,6);
              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar38 >> 0x7f,0) != '\0') ||
                    (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar38 >> 0xbf,0) != '\0') ||
                  (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar38[0x1f] < '\0') {
                pRVar28 = (RTCIntersectArguments *)This->leafIntersector;
                local_2ac0._8_8_ = uStack_2858;
                local_2ac0._0_8_ = local_2860;
                local_2ac0._16_8_ = uStack_2850;
                local_2ac0._24_8_ = uStack_2848;
                uVar27 = vmovmskps_avx(local_2ae0);
                if ((uVar27 ^ 0xff) != 0) {
                  uVar30 = (ulong)((uVar27 ^ 0xff) & 0xff);
                  pRVar5 = pRVar28 + (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 2 + 1;
                  do {
                    lVar32 = 0;
                    for (uVar25 = uVar30; (uVar25 & 1) == 0;
                        uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                      lVar32 = lVar32 + 1;
                    }
                    pRVar28 = (RTCIntersectArguments *)context;
                    cVar22 = (*(code *)pRVar5->context)
                                       (&local_27c0,ray,lVar32,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar22 != '\0') {
                      *(undefined4 *)(local_2ac0 + lVar32 * 4) = 0xffffffff;
                    }
                    uVar30 = uVar30 - 1 & uVar30;
                  } while (uVar30 != 0);
                  auVar103 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                }
                local_2ae0 = vorps_avx(local_2ac0,auVar68);
                auVar68 = _DAT_01fe9960 & ~local_2ae0;
                if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar68 >> 0x7f,0) == '\0') &&
                      (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar68 >> 0xbf,0) == '\0') &&
                    (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar68[0x1f]) goto LAB_0054c2ed;
                auVar57 = ZEXT3264(local_28a0);
                auVar67._8_4_ = 0xff800000;
                auVar67._0_8_ = 0xff800000ff800000;
                auVar67._12_4_ = 0xff800000;
                auVar67._16_4_ = 0xff800000;
                auVar67._20_4_ = 0xff800000;
                auVar67._24_4_ = 0xff800000;
                auVar67._28_4_ = 0xff800000;
                local_28a0 = vblendvps_avx(local_28a0,auVar67,local_2ae0);
              }
              goto LAB_0054bb1f;
            }
            uVar25 = root.ptr & 0xfffffffffffffff0;
            uVar27 = (uint)root.ptr & 7;
            pRVar28 = (RTCIntersectArguments *)0x0;
            local_2820 = vcmpps_avx(local_28a0,auVar71._0_32_,6);
            auVar68 = auVar103._0_32_;
            do {
              uVar4 = *(ulong *)(uVar25 + 0x20 + lVar32 * 2);
              if (uVar4 == 8) {
                auVar71 = ZEXT3264(auVar68);
                break;
              }
              auVar71._28_36_ = auVar57._28_36_;
              if ((uVar27 == 6) || (uVar27 == 1)) {
                uVar26 = *(undefined4 *)(uVar25 + 0x90 + lVar32);
                auVar53._4_4_ = uVar26;
                auVar53._0_4_ = uVar26;
                auVar53._8_4_ = uVar26;
                auVar53._12_4_ = uVar26;
                auVar53._16_4_ = uVar26;
                auVar53._20_4_ = uVar26;
                auVar53._24_4_ = uVar26;
                auVar53._28_4_ = uVar26;
                uVar26 = *(undefined4 *)(uVar25 + 0x30 + lVar32);
                auVar69._4_4_ = uVar26;
                auVar69._0_4_ = uVar26;
                auVar69._8_4_ = uVar26;
                auVar69._12_4_ = uVar26;
                auVar69._16_4_ = uVar26;
                auVar69._20_4_ = uVar26;
                auVar69._24_4_ = uVar26;
                auVar69._28_4_ = uVar26;
                auVar38 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar26 = *(undefined4 *)(uVar25 + 0xb0 + lVar32);
                auVar60._4_4_ = uVar26;
                auVar60._0_4_ = uVar26;
                auVar60._8_4_ = uVar26;
                auVar60._12_4_ = uVar26;
                auVar60._16_4_ = uVar26;
                auVar60._20_4_ = uVar26;
                auVar60._24_4_ = uVar26;
                auVar60._28_4_ = uVar26;
                auVar36 = vfmadd231ps_fma(auVar69,auVar38,auVar53);
                uVar26 = *(undefined4 *)(uVar25 + 0x50 + lVar32);
                auVar73._4_4_ = uVar26;
                auVar73._0_4_ = uVar26;
                auVar73._8_4_ = uVar26;
                auVar73._12_4_ = uVar26;
                auVar73._16_4_ = uVar26;
                auVar73._20_4_ = uVar26;
                auVar73._24_4_ = uVar26;
                auVar73._28_4_ = uVar26;
                auVar47 = vfmadd231ps_fma(auVar73,auVar38,auVar60);
                uVar26 = *(undefined4 *)(uVar25 + 0xd0 + lVar32);
                auVar61._4_4_ = uVar26;
                auVar61._0_4_ = uVar26;
                auVar61._8_4_ = uVar26;
                auVar61._12_4_ = uVar26;
                auVar61._16_4_ = uVar26;
                auVar61._20_4_ = uVar26;
                auVar61._24_4_ = uVar26;
                auVar61._28_4_ = uVar26;
                uVar26 = *(undefined4 *)(uVar25 + 0x70 + lVar32);
                auVar78._4_4_ = uVar26;
                auVar78._0_4_ = uVar26;
                auVar78._8_4_ = uVar26;
                auVar78._12_4_ = uVar26;
                auVar78._16_4_ = uVar26;
                auVar78._20_4_ = uVar26;
                auVar78._24_4_ = uVar26;
                auVar78._28_4_ = uVar26;
                uVar26 = *(undefined4 *)(uVar25 + 0xa0 + lVar32);
                auVar82._4_4_ = uVar26;
                auVar82._0_4_ = uVar26;
                auVar82._8_4_ = uVar26;
                auVar82._12_4_ = uVar26;
                auVar82._16_4_ = uVar26;
                auVar82._20_4_ = uVar26;
                auVar82._24_4_ = uVar26;
                auVar82._28_4_ = uVar26;
                uVar26 = *(undefined4 *)(uVar25 + 0x40 + lVar32);
                auVar54._4_4_ = uVar26;
                auVar54._0_4_ = uVar26;
                auVar54._8_4_ = uVar26;
                auVar54._12_4_ = uVar26;
                auVar54._16_4_ = uVar26;
                auVar54._20_4_ = uVar26;
                auVar54._24_4_ = uVar26;
                auVar54._28_4_ = uVar26;
                auVar75 = vfmadd231ps_fma(auVar78,auVar38,auVar61);
                auVar90 = vfmadd231ps_fma(auVar54,auVar38,auVar82);
                uVar26 = *(undefined4 *)(uVar25 + 0xc0 + lVar32);
                auVar62._4_4_ = uVar26;
                auVar62._0_4_ = uVar26;
                auVar62._8_4_ = uVar26;
                auVar62._12_4_ = uVar26;
                auVar62._16_4_ = uVar26;
                auVar62._20_4_ = uVar26;
                auVar62._24_4_ = uVar26;
                auVar62._28_4_ = uVar26;
                uVar26 = *(undefined4 *)(uVar25 + 0x60 + lVar32);
                auVar83._4_4_ = uVar26;
                auVar83._0_4_ = uVar26;
                auVar83._8_4_ = uVar26;
                auVar83._12_4_ = uVar26;
                auVar83._16_4_ = uVar26;
                auVar83._20_4_ = uVar26;
                auVar83._24_4_ = uVar26;
                auVar83._28_4_ = uVar26;
                uVar26 = *(undefined4 *)(uVar25 + 0xe0 + lVar32);
                auVar86._4_4_ = uVar26;
                auVar86._0_4_ = uVar26;
                auVar86._8_4_ = uVar26;
                auVar86._12_4_ = uVar26;
                auVar86._16_4_ = uVar26;
                auVar86._20_4_ = uVar26;
                auVar86._24_4_ = uVar26;
                auVar86._28_4_ = uVar26;
                auVar99 = vfmadd231ps_fma(auVar83,auVar38,auVar62);
                uVar26 = *(undefined4 *)(uVar25 + 0x80 + lVar32);
                auVar88._4_4_ = uVar26;
                auVar88._0_4_ = uVar26;
                auVar88._8_4_ = uVar26;
                auVar88._12_4_ = uVar26;
                auVar88._16_4_ = uVar26;
                auVar88._20_4_ = uVar26;
                auVar88._24_4_ = uVar26;
                auVar88._28_4_ = uVar26;
                auVar96 = vfmadd231ps_fma(auVar88,auVar38,auVar86);
                auVar17._4_4_ = fStack_297c;
                auVar17._0_4_ = local_2980;
                auVar17._8_4_ = fStack_2978;
                auVar17._12_4_ = fStack_2974;
                auVar17._16_4_ = fStack_2970;
                auVar17._20_4_ = fStack_296c;
                auVar17._24_4_ = fStack_2968;
                auVar17._28_4_ = uStack_2964;
                auVar36 = vfmsub213ps_fma(ZEXT1632(auVar36),local_29e0,auVar17);
                auVar18._4_4_ = fStack_295c;
                auVar18._0_4_ = local_2960;
                auVar18._8_4_ = fStack_2958;
                auVar18._12_4_ = fStack_2954;
                auVar18._16_4_ = fStack_2950;
                auVar18._20_4_ = fStack_294c;
                auVar18._24_4_ = fStack_2948;
                auVar18._28_4_ = uStack_2944;
                auVar47 = vfmsub213ps_fma(ZEXT1632(auVar47),local_29c0,auVar18);
                auVar19._4_4_ = fStack_293c;
                auVar19._0_4_ = local_2940;
                auVar19._8_4_ = fStack_2938;
                auVar19._12_4_ = fStack_2934;
                auVar19._16_4_ = fStack_2930;
                auVar19._20_4_ = fStack_292c;
                auVar19._24_4_ = fStack_2928;
                auVar19._28_4_ = uStack_2924;
                auVar75 = vfmsub213ps_fma(ZEXT1632(auVar75),local_29a0,auVar19);
                auVar90 = vfmsub213ps_fma(ZEXT1632(auVar90),local_29e0,auVar17);
                auVar99 = vfmsub213ps_fma(ZEXT1632(auVar99),local_29c0,auVar18);
                auVar96 = vfmsub213ps_fma(ZEXT1632(auVar96),local_29a0,auVar19);
                auVar65 = vpminsd_avx2(ZEXT1632(auVar36),ZEXT1632(auVar90));
                auVar85 = vpminsd_avx2(ZEXT1632(auVar47),ZEXT1632(auVar99));
                auVar65 = vpmaxsd_avx2(auVar65,auVar85);
                auVar85 = vpminsd_avx2(ZEXT1632(auVar75),ZEXT1632(auVar96));
                auVar85 = vpmaxsd_avx2(auVar65,auVar85);
                auVar65 = vpmaxsd_avx2(ZEXT1632(auVar36),ZEXT1632(auVar90));
                auVar58 = vpmaxsd_avx2(ZEXT1632(auVar47),ZEXT1632(auVar99));
                auVar58 = vpminsd_avx2(auVar65,auVar58);
                auVar65 = vpmaxsd_avx2(ZEXT1632(auVar75),ZEXT1632(auVar96));
                auVar58 = vpminsd_avx2(auVar58,auVar65);
                auVar65 = vpmaxsd_avx2(auVar85,local_28c0);
                auVar58 = vpminsd_avx2(auVar58,local_28a0);
                auVar65 = vcmpps_avx(auVar65,auVar58,2);
                if (uVar27 == 6) {
                  uVar26 = *(undefined4 *)(uVar25 + 0xf0 + lVar32);
                  auVar70._4_4_ = uVar26;
                  auVar70._0_4_ = uVar26;
                  auVar70._8_4_ = uVar26;
                  auVar70._12_4_ = uVar26;
                  auVar70._16_4_ = uVar26;
                  auVar70._20_4_ = uVar26;
                  auVar70._24_4_ = uVar26;
                  auVar70._28_4_ = uVar26;
                  auVar58 = vcmpps_avx(auVar70,auVar38,2);
                  uVar26 = *(undefined4 *)(uVar25 + 0x100 + lVar32);
                  auVar74._4_4_ = uVar26;
                  auVar74._0_4_ = uVar26;
                  auVar74._8_4_ = uVar26;
                  auVar74._12_4_ = uVar26;
                  auVar74._16_4_ = uVar26;
                  auVar74._20_4_ = uVar26;
                  auVar74._24_4_ = uVar26;
                  auVar74._28_4_ = uVar26;
                  auVar38 = vcmpps_avx(auVar38,auVar74,1);
                  auVar38 = vandps_avx(auVar58,auVar38);
                  auVar38 = vandps_avx(auVar38,auVar65);
                  auVar36 = auVar38._0_16_;
                  auVar47 = auVar38._16_16_;
                  goto LAB_0054bffc;
                }
                auVar36 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
              }
              else {
                uVar26 = *(undefined4 *)(uVar25 + 0x30 + lVar32);
                auVar87._4_4_ = uVar26;
                auVar87._0_4_ = uVar26;
                auVar87._8_4_ = uVar26;
                auVar87._12_4_ = uVar26;
                auVar87._16_4_ = uVar26;
                auVar87._20_4_ = uVar26;
                auVar87._24_4_ = uVar26;
                auVar87._28_4_ = uVar26;
                local_2b20._4_4_ = *(undefined4 *)(uVar25 + 0x40 + lVar32);
                local_2b20._0_4_ = local_2b20._4_4_;
                local_2b20._8_4_ = local_2b20._4_4_;
                local_2b20._12_4_ = local_2b20._4_4_;
                local_2b20._16_4_ = local_2b20._4_4_;
                local_2b20._20_4_ = local_2b20._4_4_;
                local_2b20._24_4_ = local_2b20._4_4_;
                local_2b20._28_4_ = local_2b20._4_4_;
                uVar26 = *(undefined4 *)(uVar25 + 0x50 + lVar32);
                auVar84._4_4_ = uVar26;
                auVar84._0_4_ = uVar26;
                auVar84._8_4_ = uVar26;
                auVar84._12_4_ = uVar26;
                auVar84._16_4_ = uVar26;
                auVar84._20_4_ = uVar26;
                auVar84._24_4_ = uVar26;
                auVar84._28_4_ = uVar26;
                uVar26 = *(undefined4 *)(uVar25 + 0x60 + lVar32);
                auVar95._4_4_ = uVar26;
                auVar95._0_4_ = uVar26;
                auVar95._8_4_ = uVar26;
                auVar95._12_4_ = uVar26;
                auVar95._16_4_ = uVar26;
                auVar95._20_4_ = uVar26;
                auVar95._24_4_ = uVar26;
                auVar95._28_4_ = uVar26;
                uVar26 = *(undefined4 *)(uVar25 + 0x70 + lVar32);
                auVar91._4_4_ = uVar26;
                auVar91._0_4_ = uVar26;
                auVar91._8_4_ = uVar26;
                auVar91._12_4_ = uVar26;
                auVar91._16_4_ = uVar26;
                auVar91._20_4_ = uVar26;
                auVar91._24_4_ = uVar26;
                auVar91._28_4_ = uVar26;
                uVar1 = *(undefined4 *)(uVar25 + 0x80 + lVar32);
                auVar89._4_4_ = uVar1;
                auVar89._0_4_ = uVar1;
                auVar89._8_4_ = uVar1;
                auVar89._12_4_ = uVar1;
                auVar89._16_4_ = uVar1;
                auVar89._20_4_ = uVar1;
                auVar89._24_4_ = uVar1;
                auVar89._28_4_ = uVar1;
                fVar81 = *(float *)(uVar25 + 0x90 + lVar32);
                auVar104._4_4_ = fVar81;
                auVar104._0_4_ = fVar81;
                auVar104._8_4_ = fVar81;
                auVar104._12_4_ = fVar81;
                auVar104._16_4_ = fVar81;
                auVar104._20_4_ = fVar81;
                auVar104._24_4_ = fVar81;
                auVar104._28_4_ = fVar81;
                fVar34 = *(float *)(uVar25 + 0xa0 + lVar32);
                auVar105._4_4_ = fVar34;
                auVar105._0_4_ = fVar34;
                auVar105._8_4_ = fVar34;
                auVar105._12_4_ = fVar34;
                auVar105._16_4_ = fVar34;
                auVar105._20_4_ = fVar34;
                auVar105._24_4_ = fVar34;
                auVar105._28_4_ = fVar34;
                fVar35 = *(float *)(uVar25 + 0xb0 + lVar32);
                auVar79._4_4_ = fVar35;
                auVar79._0_4_ = fVar35;
                auVar79._8_4_ = fVar35;
                auVar79._12_4_ = fVar35;
                auVar79._16_4_ = fVar35;
                auVar79._20_4_ = fVar35;
                auVar79._24_4_ = fVar35;
                auVar79._28_4_ = fVar35;
                uVar2 = *(undefined4 *)(uVar25 + 0xc0 + lVar32);
                auVar98._4_4_ = uVar2;
                auVar98._0_4_ = uVar2;
                auVar98._8_4_ = uVar2;
                auVar98._12_4_ = uVar2;
                auVar98._16_4_ = uVar2;
                auVar98._20_4_ = uVar2;
                auVar98._24_4_ = uVar2;
                auVar98._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar25 + 0xd0 + lVar32);
                auVar100._4_4_ = uVar2;
                auVar100._0_4_ = uVar2;
                auVar100._8_4_ = uVar2;
                auVar100._12_4_ = uVar2;
                auVar100._16_4_ = uVar2;
                auVar100._20_4_ = uVar2;
                auVar100._24_4_ = uVar2;
                auVar100._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar25 + 0xe0 + lVar32);
                auVar63._4_4_ = uVar2;
                auVar63._0_4_ = uVar2;
                auVar63._8_4_ = uVar2;
                auVar63._12_4_ = uVar2;
                auVar63._16_4_ = uVar2;
                auVar63._20_4_ = uVar2;
                auVar63._24_4_ = uVar2;
                auVar63._28_4_ = uVar2;
                fVar40 = *(float *)(uVar25 + 0xf0 + lVar32);
                fVar42 = *(float *)(uVar25 + 0x100 + lVar32);
                fVar44 = *(float *)(uVar25 + 0x110 + lVar32);
                auVar36 = vfmadd231ps_fma(auVar98,(undefined1  [32])local_2aa0.field_0.z.field_0,
                                          auVar104);
                auVar47 = vfmadd231ps_fma(auVar100,(undefined1  [32])local_2aa0.field_0.z.field_0,
                                          auVar105);
                auVar75 = vfmadd231ps_fma(auVar63,(undefined1  [32])local_2aa0.field_0.z.field_0,
                                          auVar79);
                auVar71._0_4_ = fVar81 * (float)local_2a00._0_4_;
                auVar71._4_4_ = fVar81 * (float)local_2a00._4_4_;
                auVar71._8_4_ = fVar81 * fStack_29f8;
                auVar71._12_4_ = fVar81 * fStack_29f4;
                auVar71._16_4_ = fVar81 * fStack_29f0;
                auVar71._20_4_ = fVar81 * fStack_29ec;
                auVar71._24_4_ = fVar81 * fStack_29e8;
                auVar6._4_4_ = fVar34 * (float)local_2a00._4_4_;
                auVar6._0_4_ = fVar34 * (float)local_2a00._0_4_;
                auVar6._8_4_ = fVar34 * fStack_29f8;
                auVar6._12_4_ = fVar34 * fStack_29f4;
                auVar6._16_4_ = fVar34 * fStack_29f0;
                auVar6._20_4_ = fVar34 * fStack_29ec;
                auVar6._24_4_ = fVar34 * fStack_29e8;
                auVar6._28_4_ = fVar34;
                auVar7._4_4_ = fVar35 * (float)local_2a00._4_4_;
                auVar7._0_4_ = fVar35 * (float)local_2a00._0_4_;
                auVar7._8_4_ = fVar35 * fStack_29f8;
                auVar7._12_4_ = fVar35 * fStack_29f4;
                auVar7._16_4_ = fVar35 * fStack_29f0;
                auVar7._20_4_ = fVar35 * fStack_29ec;
                auVar7._24_4_ = fVar35 * fStack_29e8;
                auVar7._28_4_ = fVar81;
                auVar90 = vfmadd231ps_fma(auVar71._0_32_,local_2a20,auVar95);
                auVar99 = vfmadd231ps_fma(auVar6,local_2a20,auVar91);
                auVar96 = vfmadd231ps_fma(auVar7,auVar89,local_2a20);
                auVar16._4_4_ = local_2aa0._36_4_;
                auVar16._0_4_ = local_2aa0._32_4_;
                auVar16._8_4_ = local_2aa0._40_4_;
                auVar16._12_4_ = local_2aa0._44_4_;
                auVar16._16_4_ = local_2aa0._48_4_;
                auVar16._20_4_ = local_2aa0._52_4_;
                auVar16._24_4_ = local_2aa0._56_4_;
                auVar16._28_4_ = local_2aa0._60_4_;
                auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar16,auVar95);
                fStack_27e4 = *(float *)(uVar25 + 0x120 + lVar32);
                auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar16,auVar91);
                fStack_27c4 = *(float *)(uVar25 + 0x130 + lVar32);
                fVar81 = *(float *)(uVar25 + 0x140 + lVar32);
                auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar16,auVar89);
                auVar38 = *(undefined1 (*) [32])(ray + 0xe0);
                fVar34 = auVar38._0_4_;
                fVar39 = auVar38._4_4_;
                auVar8._4_4_ = fVar39 * fVar40;
                auVar8._0_4_ = fVar34 * fVar40;
                fVar41 = auVar38._8_4_;
                auVar8._8_4_ = fVar41 * fVar40;
                fVar43 = auVar38._12_4_;
                auVar8._12_4_ = fVar43 * fVar40;
                fVar45 = auVar38._16_4_;
                auVar8._16_4_ = fVar45 * fVar40;
                fVar48 = auVar38._20_4_;
                auVar8._20_4_ = fVar48 * fVar40;
                fVar50 = auVar38._24_4_;
                auVar8._24_4_ = fVar50 * fVar40;
                auVar8._28_4_ = uVar26;
                auVar9._4_4_ = fVar42 * fVar39;
                auVar9._0_4_ = fVar42 * fVar34;
                auVar9._8_4_ = fVar42 * fVar41;
                auVar9._12_4_ = fVar42 * fVar43;
                auVar9._16_4_ = fVar42 * fVar45;
                auVar9._20_4_ = fVar42 * fVar48;
                auVar9._24_4_ = fVar42 * fVar50;
                auVar9._28_4_ = uVar1;
                auVar10._4_4_ = fVar39 * fVar44;
                auVar10._0_4_ = fVar34 * fVar44;
                auVar10._8_4_ = fVar41 * fVar44;
                auVar10._12_4_ = fVar43 * fVar44;
                auVar10._16_4_ = fVar45 * fVar44;
                auVar10._20_4_ = fVar48 * fVar44;
                auVar10._24_4_ = fVar50 * fVar44;
                auVar10._28_4_ = fVar42;
                auVar64._8_4_ = 0x3f800000;
                auVar64._0_8_ = 0x3f8000003f800000;
                auVar64._12_4_ = 0x3f800000;
                auVar64._16_4_ = 0x3f800000;
                auVar64._20_4_ = 0x3f800000;
                auVar64._24_4_ = 0x3f800000;
                auVar64._28_4_ = 0x3f800000;
                auVar38 = vsubps_avx(auVar64,auVar38);
                auVar65 = ZEXT1232(ZEXT812(0)) << 0x20;
                auVar97 = vfmadd231ps_fma(auVar8,auVar38,auVar65);
                auVar92 = vfmadd231ps_fma(auVar9,auVar38,auVar65);
                auVar101 = vfmadd231ps_fma(auVar10,auVar38,ZEXT1232(ZEXT812(0)) << 0x20);
                fVar35 = auVar38._0_4_;
                local_2800 = fVar35 + fStack_27e4 * fVar34;
                fVar40 = auVar38._4_4_;
                fStack_27fc = fVar40 + fStack_27e4 * fVar39;
                fVar42 = auVar38._8_4_;
                fStack_27f8 = fVar42 + fStack_27e4 * fVar41;
                fVar44 = auVar38._12_4_;
                fStack_27f4 = fVar44 + fStack_27e4 * fVar43;
                fVar46 = auVar38._16_4_;
                fStack_27f0 = fVar46 + fStack_27e4 * fVar45;
                fVar49 = auVar38._20_4_;
                fStack_27ec = fVar49 + fStack_27e4 * fVar48;
                fVar51 = auVar38._24_4_;
                fStack_27e8 = fVar51 + fStack_27e4 * fVar50;
                fVar52 = auVar38._28_4_;
                fStack_27e4 = fVar52 + fStack_27e4;
                local_27e0 = fStack_27c4 * fVar34 + fVar35;
                fStack_27dc = fStack_27c4 * fVar39 + fVar40;
                fStack_27d8 = fStack_27c4 * fVar41 + fVar42;
                fStack_27d4 = fStack_27c4 * fVar43 + fVar44;
                fStack_27d0 = fStack_27c4 * fVar45 + fVar46;
                fStack_27cc = fStack_27c4 * fVar48 + fVar49;
                fStack_27c8 = fStack_27c4 * fVar50 + fVar51;
                fStack_27c4 = fStack_27c4 + fVar52;
                local_2b80._4_4_ = fVar81 * fVar39 + fVar40;
                local_2b80._0_4_ = fVar81 * fVar34 + fVar35;
                fStack_2b78 = fVar81 * fVar41 + fVar42;
                fStack_2b74 = fVar81 * fVar43 + fVar44;
                fStack_2b70 = fVar81 * fVar45 + fVar46;
                fStack_2b6c = fVar81 * fVar48 + fVar49;
                fStack_2b68 = fVar81 * fVar50 + fVar51;
                fStack_2b64 = fVar81 + fVar52;
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),local_2a40,auVar87);
                auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),local_2a40,local_2b20);
                auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar84,local_2a40);
                auVar38 = vandps_avx(ZEXT1632(auVar90),local_2840);
                auVar66._8_4_ = 0x219392ef;
                auVar66._0_8_ = 0x219392ef219392ef;
                auVar66._12_4_ = 0x219392ef;
                auVar66._16_4_ = 0x219392ef;
                auVar66._20_4_ = 0x219392ef;
                auVar66._24_4_ = 0x219392ef;
                auVar66._28_4_ = 0x219392ef;
                auVar38 = vcmpps_avx(auVar38,auVar66,1);
                auVar65 = vblendvps_avx(ZEXT1632(auVar90),auVar66,auVar38);
                auVar38 = vandps_avx(ZEXT1632(auVar99),local_2840);
                auVar38 = vcmpps_avx(auVar38,auVar66,1);
                auVar85 = vblendvps_avx(ZEXT1632(auVar99),auVar66,auVar38);
                auVar15._4_4_ = local_2aa0._4_4_;
                auVar15._0_4_ = local_2aa0._0_4_;
                auVar15._8_4_ = local_2aa0._8_4_;
                auVar15._12_4_ = local_2aa0._12_4_;
                auVar15._16_4_ = local_2aa0._16_4_;
                auVar15._20_4_ = local_2aa0._20_4_;
                auVar15._24_4_ = local_2aa0._24_4_;
                auVar15._28_4_ = local_2aa0._28_4_;
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar15,auVar87);
                auVar99 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar15,local_2b20);
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar15,auVar84);
                auVar38 = vandps_avx(ZEXT1632(auVar96),local_2840);
                auVar38 = vcmpps_avx(auVar38,auVar66,1);
                auVar58 = vrcpps_avx(auVar65);
                auVar38 = vblendvps_avx(ZEXT1632(auVar96),auVar66,auVar38);
                auVar37._8_4_ = 0x3f800000;
                auVar37._0_8_ = 0x3f8000003f800000;
                auVar37._12_4_ = 0x3f800000;
                auVar37._16_4_ = 0x3f800000;
                auVar37._20_4_ = 0x3f800000;
                auVar37._24_4_ = 0x3f800000;
                auVar37._28_4_ = 0x3f800000;
                auVar36 = vfnmadd213ps_fma(auVar65,auVar58,auVar37);
                auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar58,auVar58);
                auVar65 = vrcpps_avx(auVar85);
                auVar47 = vfnmadd213ps_fma(auVar85,auVar65,auVar37);
                auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar65,auVar65);
                auVar65 = vrcpps_avx(auVar38);
                auVar75 = vfnmadd213ps_fma(auVar38,auVar65,auVar37);
                auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar65,auVar65);
                auVar38 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar90));
                auVar20._4_4_ = fStack_27fc;
                auVar20._0_4_ = local_2800;
                auVar20._8_4_ = fStack_27f8;
                auVar20._12_4_ = fStack_27f4;
                auVar20._16_4_ = fStack_27f0;
                auVar20._20_4_ = fStack_27ec;
                auVar20._24_4_ = fStack_27e8;
                auVar20._28_4_ = fStack_27e4;
                auVar65 = vsubps_avx(auVar20,ZEXT1632(auVar90));
                auVar80._0_4_ = auVar36._0_4_ * auVar38._0_4_;
                auVar80._4_4_ = auVar36._4_4_ * auVar38._4_4_;
                auVar80._8_4_ = auVar36._8_4_ * auVar38._8_4_;
                auVar80._12_4_ = auVar36._12_4_ * auVar38._12_4_;
                auVar80._16_4_ = auVar38._16_4_ * 0.0;
                auVar80._20_4_ = auVar38._20_4_ * 0.0;
                auVar80._24_4_ = auVar38._24_4_ * 0.0;
                auVar80._28_4_ = 0;
                auVar55._0_4_ = auVar36._0_4_ * auVar65._0_4_;
                auVar55._4_4_ = auVar36._4_4_ * auVar65._4_4_;
                auVar55._8_4_ = auVar36._8_4_ * auVar65._8_4_;
                auVar55._12_4_ = auVar36._12_4_ * auVar65._12_4_;
                auVar55._16_4_ = auVar65._16_4_ * 0.0;
                auVar55._20_4_ = auVar65._20_4_ * 0.0;
                auVar55._24_4_ = auVar65._24_4_ * 0.0;
                auVar55._28_4_ = 0;
                auVar38 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar99));
                auVar21._4_4_ = fStack_27dc;
                auVar21._0_4_ = local_27e0;
                auVar21._8_4_ = fStack_27d8;
                auVar21._12_4_ = fStack_27d4;
                auVar21._16_4_ = fStack_27d0;
                auVar21._20_4_ = fStack_27cc;
                auVar21._24_4_ = fStack_27c8;
                auVar21._28_4_ = fStack_27c4;
                auVar65 = vsubps_avx(auVar21,ZEXT1632(auVar99));
                auVar11._4_4_ = auVar47._4_4_ * auVar38._4_4_;
                auVar11._0_4_ = auVar47._0_4_ * auVar38._0_4_;
                auVar11._8_4_ = auVar47._8_4_ * auVar38._8_4_;
                auVar11._12_4_ = auVar47._12_4_ * auVar38._12_4_;
                auVar11._16_4_ = auVar38._16_4_ * 0.0;
                auVar11._20_4_ = auVar38._20_4_ * 0.0;
                auVar11._24_4_ = auVar38._24_4_ * 0.0;
                auVar11._28_4_ = auVar38._28_4_;
                auVar12._4_4_ = auVar47._4_4_ * auVar65._4_4_;
                auVar12._0_4_ = auVar47._0_4_ * auVar65._0_4_;
                auVar12._8_4_ = auVar47._8_4_ * auVar65._8_4_;
                auVar12._12_4_ = auVar47._12_4_ * auVar65._12_4_;
                auVar12._16_4_ = auVar65._16_4_ * 0.0;
                auVar12._20_4_ = auVar65._20_4_ * 0.0;
                auVar12._24_4_ = auVar65._24_4_ * 0.0;
                auVar12._28_4_ = auVar65._28_4_;
                auVar103 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar38 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar102));
                auVar13._4_4_ = auVar75._4_4_ * auVar38._4_4_;
                auVar13._0_4_ = auVar75._0_4_ * auVar38._0_4_;
                auVar13._8_4_ = auVar75._8_4_ * auVar38._8_4_;
                auVar13._12_4_ = auVar75._12_4_ * auVar38._12_4_;
                auVar13._16_4_ = auVar38._16_4_ * 0.0;
                auVar13._20_4_ = auVar38._20_4_ * 0.0;
                auVar13._24_4_ = auVar38._24_4_ * 0.0;
                auVar13._28_4_ = auVar38._28_4_;
                auVar38 = vsubps_avx(_local_2b80,ZEXT1632(auVar102));
                auVar14._4_4_ = auVar75._4_4_ * auVar38._4_4_;
                auVar14._0_4_ = auVar75._0_4_ * auVar38._0_4_;
                auVar14._8_4_ = auVar75._8_4_ * auVar38._8_4_;
                auVar14._12_4_ = auVar75._12_4_ * auVar38._12_4_;
                auVar14._16_4_ = auVar38._16_4_ * 0.0;
                auVar14._20_4_ = auVar38._20_4_ * 0.0;
                auVar14._24_4_ = auVar38._24_4_ * 0.0;
                auVar14._28_4_ = auVar38._28_4_;
                auVar38 = vpminsd_avx2(auVar80,auVar55);
                auVar65 = vpminsd_avx2(auVar11,auVar12);
                auVar38 = vpmaxsd_avx2(auVar38,auVar65);
                auVar65 = vpminsd_avx2(auVar13,auVar14);
                auVar85 = vpmaxsd_avx2(auVar38,auVar65);
                auVar38 = vpmaxsd_avx2(auVar80,auVar55);
                auVar65 = vpmaxsd_avx2(auVar11,auVar12);
                auVar65 = vpminsd_avx2(auVar38,auVar65);
                auVar38 = vpmaxsd_avx2(auVar13,auVar14);
                auVar65 = vpminsd_avx2(auVar65,auVar38);
                auVar38 = vpmaxsd_avx2(auVar85,local_28c0);
                auVar65 = vpminsd_avx2(auVar65,local_28a0);
                auVar38 = vcmpps_avx(auVar38,auVar65,2);
                auVar36 = auVar38._0_16_;
                auVar47 = auVar38._16_16_;
LAB_0054bffc:
                auVar36 = vpackssdw_avx(auVar36,auVar47);
              }
              auVar47 = vpackssdw_avx(local_2820._0_16_,local_2820._16_16_);
              auVar57 = ZEXT1664(auVar47);
              auVar36 = vpand_avx(auVar36,auVar47);
              auVar38 = vpmovzxwd_avx2(auVar36);
              auVar38 = vpslld_avx2(auVar38,0x1f);
              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar38 >> 0x7f,0) == '\0') &&
                    (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar38 >> 0xbf,0) == '\0') &&
                  (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar38[0x1f]) {
                auVar71 = ZEXT3264(auVar68);
                uVar4 = uVar30;
              }
              else {
                auVar38 = vblendvps_avx(auVar103._0_32_,auVar85,auVar38);
                auVar71 = ZEXT3264(auVar38);
                if (uVar30 != 8) {
                  *puVar31 = uVar30;
                  puVar31 = puVar31 + 1;
                  *pauVar33 = auVar68;
                  pauVar33 = pauVar33 + 1;
                }
              }
              uVar30 = uVar4;
              auVar68 = auVar71._0_32_;
              lVar32 = lVar32 + 4;
            } while (lVar32 != 0);
            if (uVar30 == 8) goto LAB_0054c0c7;
            auVar68 = vcmpps_avx(local_28a0,auVar71._0_32_,6);
            uVar26 = vmovmskps_avx(auVar68);
            root.ptr = uVar30;
          } while ((byte)uVar29 < (byte)POPCOUNT(uVar26));
          *puVar31 = uVar30;
          puVar31 = puVar31 + 1;
          *pauVar33 = auVar71._0_32_;
          pauVar33 = pauVar33 + 1;
        }
        else {
          for (; pRVar28 != (RTCIntersectArguments *)0x0;
              pRVar28 = (RTCIntersectArguments *)
                        ((ulong)((long)&pRVar28[-1].intersect + 7U) & (ulong)pRVar28)) {
            sVar3 = 0;
            for (pRVar5 = pRVar28; ((ulong)pRVar5 & 1) == 0;
                pRVar5 = (RTCIntersectArguments *)((ulong)pRVar5 >> 1 | 0x8000000000000000)) {
              sVar3 = sVar3 + 1;
            }
            auVar57 = ZEXT1664(auVar57._0_16_);
            bVar23 = occluded1(This,bvh,root,sVar3,(Precalculations *)&local_27c0,ray,
                               (TravRayK<8,_false> *)&local_2aa0.field_0,context);
            if (bVar23) {
              *(undefined4 *)(local_2ae0 + sVar3 * 4) = 0xffffffff;
            }
            auVar103 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
          }
          auVar71 = ZEXT3264(auVar68);
          auVar68 = _DAT_01fe9960 & ~local_2ae0;
          iVar24 = 3;
          if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar68 >> 0x7f,0) != '\0') ||
                (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar68 >> 0xbf,0) != '\0') ||
              (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar68[0x1f] < '\0') {
            auVar57 = ZEXT3264(local_28a0);
            auVar68._8_4_ = 0xff800000;
            auVar68._0_8_ = 0xff800000ff800000;
            auVar68._12_4_ = 0xff800000;
            auVar68._16_4_ = 0xff800000;
            auVar68._20_4_ = 0xff800000;
            auVar68._24_4_ = 0xff800000;
            auVar68._28_4_ = 0xff800000;
            local_28a0 = vblendvps_avx(local_28a0,auVar68,local_2ae0);
            iVar24 = 2;
          }
          pRVar28 = (RTCIntersectArguments *)0x0;
          if (uVar29 < (uint)POPCOUNT(uVar26)) goto LAB_0054bb5c;
        }
LAB_0054c0c7:
        pRVar28 = (RTCIntersectArguments *)0x0;
      } while (iVar24 != 3);
LAB_0054c2ed:
      auVar68 = vandps_avx(local_2880,local_2ae0);
      auVar56._8_4_ = 0xff800000;
      auVar56._0_8_ = 0xff800000ff800000;
      auVar56._12_4_ = 0xff800000;
      auVar56._16_4_ = 0xff800000;
      auVar56._20_4_ = 0xff800000;
      auVar56._24_4_ = 0xff800000;
      auVar56._28_4_ = 0xff800000;
      auVar68 = vmaskmovps_avx(auVar68,auVar56);
      *(undefined1 (*) [32])(ray + 0x100) = auVar68;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }